

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O1

void Resmpl_Exec_LinearUp(RESMPL_STATE *CAA,UINT32 length,WAVE_32BS *retSample)

{
  uint uVar1;
  int iVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  UINT32 UVar11;
  uint uVar12;
  ulong uVar13;
  DEV_SMPL *StreamPnt [2];
  DEV_SMPL *local_48;
  DEV_SMPL *local_40;
  
  if (length != 0) {
    uVar1 = CAA->smpRateSrc;
    uVar13 = 0;
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (ulong)CAA->smpP * (ulong)uVar1 * 0x800;
      auVar5 = auVar5 / ZEXT416(CAA->smpRateDst);
      uVar7 = auVar5._0_8_;
      iVar6 = auVar5._0_4_;
      uVar12 = iVar6 + 0x7ffU >> 0xb;
      Resmpl_EnsureBuffers(CAA,(uVar12 - CAA->smpNext) + 2);
      pDVar3 = CAA->smplBufs[0];
      pDVar4 = CAA->smplBufs[1];
      *pDVar3 = (CAA->lSmpl).L;
      *pDVar4 = (CAA->lSmpl).R;
      pDVar3[1] = (CAA->nSmpl).L;
      pDVar4[1] = (CAA->nSmpl).R;
      UVar11 = uVar12 - CAA->smpNext;
      if (UVar11 != 0) {
        local_48 = pDVar3 + 2;
        local_40 = pDVar4 + 2;
        (*CAA->StreamUpdate)(CAA->su_DataPtr,UVar11,&local_48);
      }
      iVar6 = iVar6 + CAA->smpNext * -0x800;
      CAA->smpLast = (uint)(uVar7 >> 0xb) & 0x1fffff;
      CAA->smpNext = uVar12;
      uVar7 = uVar7 & 0x7ff;
      uVar8 = iVar6 + 0x800U >> 0xb;
      uVar12 = iVar6 + 0xfffU >> 0xb;
      iVar6 = pDVar4[uVar8];
      iVar2 = pDVar4[uVar12];
      uVar9 = (long)CAA->volumeL *
              ((long)pDVar3[uVar12] * uVar7 + (long)pDVar3[uVar8] * (0x800 - uVar7));
      uVar10 = uVar9 + 0x7ff;
      if (-1 < (long)uVar9) {
        uVar10 = uVar9;
      }
      retSample[uVar13].L = retSample[uVar13].L + (int)(uVar10 >> 0xb);
      uVar10 = (long)CAA->volumeR * ((long)iVar2 * uVar7 + (long)iVar6 * (0x800 - uVar7));
      uVar7 = uVar10 + 0x7ff;
      if (-1 < (long)uVar10) {
        uVar7 = uVar10;
      }
      retSample[uVar13].R = retSample[uVar13].R + (int)(uVar7 >> 0xb);
      (CAA->lSmpl).L = pDVar3[uVar8];
      (CAA->lSmpl).R = pDVar4[uVar8];
      (CAA->nSmpl).L = pDVar3[uVar12];
      (CAA->nSmpl).R = pDVar4[uVar12];
      CAA->smpP = CAA->smpP + 1;
      uVar13 = uVar13 + 1;
    } while (length != uVar13);
  }
  uVar1 = CAA->smpRateSrc;
  if (uVar1 <= CAA->smpLast) {
    CAA->smpLast = CAA->smpLast - uVar1;
    CAA->smpNext = CAA->smpNext - uVar1;
    CAA->smpP = CAA->smpP - CAA->smpRateDst;
  }
  return;
}

Assistant:

static void Resmpl_Exec_LinearUp(RESMPL_STATE* CAA, UINT32 length, WAVE_32BS* retSample)
{
	// RESALGO_LINEAR_UP: Linear Upsampling
	DEV_SMPL* CurBufL;
	DEV_SMPL* CurBufR;
	DEV_SMPL* StreamPnt[0x02];
	UINT32 InBase;
	UINT32 InPos;
	UINT32 OutPos;
	UINT32 SmpFrc;	// Sample Fraction
	UINT32 InPre;
	UINT32 InNow;
	SLINT InPosL;
	INT64 TempSmpL;
	INT64 TempSmpR;
	INT32 SmpCnt;	// must be signed, else I'm getting calculation errors
	UINT64 ChipSmpRateFP;
	
	ChipSmpRateFP = FIXPNT_FACT * (UINT64)CAA->smpRateSrc;
	// TODO: Make it work *properly* with large blocks. (this is very hackish)
	for (OutPos = 0; OutPos < length; OutPos ++)
	{
		InPosL = (SLINT)(CAA->smpP * ChipSmpRateFP / CAA->smpRateDst);
		InPre = (UINT32)fp2i_floor(InPosL);
		InNow = (UINT32)fp2i_ceil(InPosL);
		
		Resmpl_EnsureBuffers(CAA, InNow - CAA->smpNext + 2);
		CurBufL = CAA->smplBufs[0];
		CurBufR = CAA->smplBufs[1];
		
		CurBufL[0] = CAA->lSmpl.L;
		CurBufR[0] = CAA->lSmpl.R;
		CurBufL[1] = CAA->nSmpl.L;
		CurBufR[1] = CAA->nSmpl.R;
		if (InNow != CAA->smpNext)
		{
			StreamPnt[0] = &CurBufL[2];
			StreamPnt[1] = &CurBufR[2];
			CAA->StreamUpdate(CAA->su_DataPtr, InNow - CAA->smpNext, StreamPnt);
		}
		
		InBase = FIXPNT_FACT + (UINT32)(InPosL - (SLINT)CAA->smpNext * FIXPNT_FACT);
		SmpCnt = FIXPNT_FACT;
		CAA->smpLast = InPre;
		CAA->smpNext = InNow;
		//for (OutPos = 0; OutPos < length; OutPos ++)
		//{
		//InPos = InBase + (UINT32)(OutPos * ChipSmpRateFP / CAA->smpRateDst);
		InPos = InBase;
		
		InPre = fp2i_floor(InPos);
		InNow = fp2i_ceil(InPos);
		SmpFrc = getfraction(InPos);
		
		// Linear interpolation
		TempSmpL = ((INT64)CurBufL[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufL[InNow] * SmpFrc);
		TempSmpR = ((INT64)CurBufR[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufR[InNow] * SmpFrc);
		retSample[OutPos].L += (INT32)(TempSmpL * CAA->volumeL / SmpCnt);
		retSample[OutPos].R += (INT32)(TempSmpR * CAA->volumeR / SmpCnt);
		//}
		CAA->lSmpl.L = CurBufL[InPre];
		CAA->lSmpl.R = CurBufR[InPre];
		CAA->nSmpl.L = CurBufL[InNow];
		CAA->nSmpl.R = CurBufR[InNow];
		CAA->smpP ++;
	}
	
	if (CAA->smpLast >= CAA->smpRateSrc)
	{
		CAA->smpLast -= CAA->smpRateSrc;
		CAA->smpNext -= CAA->smpRateSrc;
		CAA->smpP -= CAA->smpRateDst;
	}
	
	return;
}